

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict
right_op(c2m_ctx_t c2m_ctx,int no_err_p,int token,int token2,nonterm_func_t left,
        nonterm_func_t right)

{
  int iVar1;
  node_t_conflict pnVar2;
  node_t_conflict op;
  node *pnVar3;
  node_code_t code;
  pos_t pos;
  node_code_t local_44;
  pos_t local_40;
  
  pnVar2 = (*left)(c2m_ctx,no_err_p);
  pnVar3 = &err_struct;
  if ((pnVar2 != &err_struct) &&
     ((iVar1 = match(c2m_ctx,token,&local_40,&local_44,(node_t_conflict *)0x0), iVar1 != 0 ||
      ((pnVar3 = pnVar2, -1 < token2 &&
       (iVar1 = match(c2m_ctx,token2,&local_40,&local_44,(node_t_conflict *)0x0), iVar1 != 0)))))) {
    pnVar2 = new_pos_node1(c2m_ctx,local_44,local_40,pnVar2);
    op = (*right)(c2m_ctx,no_err_p);
    pnVar3 = &err_struct;
    if (op != &err_struct) {
      op_append(c2m_ctx,pnVar2,op);
      pnVar3 = pnVar2;
    }
  }
  return pnVar3;
}

Assistant:

static node_t right_op (c2m_ctx_t c2m_ctx, int no_err_p, int token, int token2, nonterm_func_t left,
                        nonterm_func_t right) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  P (left);
  if (MC (token, pos, code) || (token2 >= 0 && MC (token2, pos, code))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    P (right);
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}